

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int vdbeRecordCompareString(int nKey1,void *pKey1,UnpackedRecord *pPKey2)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  long in_FS_OFFSET;
  int serial_type;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = (uint)*(char *)((long)pKey1 + 1);
  while ((int)local_3c < 0xc) {
    if ((-1 < (int)local_3c) ||
       (sqlite3GetVarint32((uchar *)((long)pKey1 + 1),&local_3c), (int)local_3c < 0xc))
    goto LAB_001564d2;
  }
  if ((local_3c & 1) != 0) {
    uVar4 = local_3c - 0xc >> 1;
    if (nKey1 < (int)(*pKey1 + uVar4)) {
      iVar3 = 0;
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x16043,
                  "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
      pPKey2->errCode = '\v';
      goto LAB_00156523;
    }
    uVar1 = pPKey2->n;
    uVar2 = uVar4;
    if ((int)uVar1 < (int)uVar4) {
      uVar2 = uVar1;
    }
    iVar3 = memcmp((void *)((ulong)*pKey1 + (long)pKey1),(pPKey2->u).z,(long)(int)uVar2);
    if (iVar3 < 1) {
      if (-1 < iVar3) {
        if (uVar4 == uVar1) {
          if (pPKey2->nField < 2) {
            iVar3 = (int)pPKey2->default_rc;
            pPKey2->eqSeen = '\x01';
            goto LAB_00156523;
          }
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            iVar3 = sqlite3VdbeRecordCompareWithSkip(nKey1,pKey1,pPKey2,1);
            return iVar3;
          }
          goto LAB_001565c7;
        }
        if ((int)uVar1 < (int)uVar4) goto LAB_001564de;
      }
LAB_001564d2:
      iVar3 = (int)pPKey2->r1;
LAB_00156523:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return iVar3;
      }
LAB_001565c7:
      __stack_chk_fail();
    }
  }
LAB_001564de:
  iVar3 = (int)pPKey2->r2;
  goto LAB_00156523;
}

Assistant:

static int vdbeRecordCompareString(
  int nKey1, const void *pKey1, /* Left key */
  UnpackedRecord *pPKey2        /* Right key */
){
  const u8 *aKey1 = (const u8*)pKey1;
  int serial_type;
  int res;

  assert( pPKey2->aMem[0].flags & MEM_Str );
  assert( pPKey2->aMem[0].n == pPKey2->n );
  assert( pPKey2->aMem[0].z == pPKey2->u.z );
  vdbeAssertFieldCountWithinLimits(nKey1, pKey1, pPKey2->pKeyInfo);
  serial_type = (signed char)(aKey1[1]);

vrcs_restart:
  if( serial_type<12 ){
    if( serial_type<0 ){
      sqlite3GetVarint32(&aKey1[1], (u32*)&serial_type);
      if( serial_type>=12 ) goto vrcs_restart;
      assert( CORRUPT_DB );
    }
    res = pPKey2->r1;      /* (pKey1/nKey1) is a number or a null */
  }else if( !(serial_type & 0x01) ){
    res = pPKey2->r2;      /* (pKey1/nKey1) is a blob */
  }else{
    int nCmp;
    int nStr;
    int szHdr = aKey1[0];

    nStr = (serial_type-12) / 2;
    if( (szHdr + nStr) > nKey1 ){
      pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
      return 0;    /* Corruption */
    }
    nCmp = MIN( pPKey2->n, nStr );
    res = memcmp(&aKey1[szHdr], pPKey2->u.z, nCmp);

    if( res>0 ){
      res = pPKey2->r2;
    }else if( res<0 ){
      res = pPKey2->r1;
    }else{
      res = nStr - pPKey2->n;
      if( res==0 ){
        if( pPKey2->nField>1 ){
          res = sqlite3VdbeRecordCompareWithSkip(nKey1, pKey1, pPKey2, 1);
        }else{
          res = pPKey2->default_rc;
          pPKey2->eqSeen = 1;
        }
      }else if( res>0 ){
        res = pPKey2->r2;
      }else{
        res = pPKey2->r1;
      }
    }
  }

  assert( vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, res)
       || CORRUPT_DB
       || pPKey2->pKeyInfo->db->mallocFailed
  );
  return res;
}